

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
App::renderTextures_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,App *this,Glyphs *glyphs,Config *config,Font *font,
          vector<Config::Size,_std::allocator<Config::Size>_> *pages)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t ch;
  int y_00;
  int x_00;
  bool bVar3;
  uint32_t color;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_type sVar8;
  size_t sVar9;
  ostream *poVar10;
  reference pvVar11;
  string local_300;
  string local_2e0;
  undefined1 local_2c0 [8];
  __string_type fileName;
  stringstream local_298 [8];
  stringstream ss;
  ostream local_288 [376];
  uint local_110;
  uint local_10c;
  uint32_t g2;
  uint32_t g1;
  uint32_t rb2;
  uint32_t rb1;
  uint32_t a1;
  uint32_t a0;
  uint32_t bgColor;
  uint32_t fgColor;
  value_type *end;
  uint *cur;
  int local_c0;
  int local_bc;
  uint32_t y;
  uint32_t x;
  GlyphInfo *glyph;
  pair<const_unsigned_int,_GlyphInfo> *kv;
  const_iterator __end2;
  const_iterator __begin2;
  Glyphs *__range2;
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> surface;
  Size *s;
  uint32_t page;
  int local_58;
  size_t pageNameDigits;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  vector<Config::Size,_std::allocator<Config::Size>_> *pages_local;
  Font *font_local;
  Config *config_local;
  Glyphs *glyphs_local;
  
  fileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)font;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  bVar3 = std::vector<Config::Size,_std::allocator<Config::Size>_>::empty
                    ((vector<Config::Size,_std::allocator<Config::Size>_> *)
                     fileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    sVar8 = std::vector<Config::Size,_std::allocator<Config::Size>_>::size
                      ((vector<Config::Size,_std::allocator<Config::Size>_> *)
                       fileNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar9 = getNumberLen((int)sVar8 - 1);
    for (s._0_4_ = 0;
        sVar8 = std::vector<Config::Size,_std::allocator<Config::Size>_>::size
                          ((vector<Config::Size,_std::allocator<Config::Size>_> *)
                           fileNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), (uint)s < sVar8;
        s._0_4_ = (uint)s + 1) {
      surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           &std::vector<Config::Size,_std::allocator<Config::Size>_>::operator[]
                      ((vector<Config::Size,_std::allocator<Config::Size>_> *)
                       fileNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)s)->w;
      uVar1 = ((const_reference)
              surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)->w;
      uVar2 = ((const_reference)
              surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)->h;
      __range2._4_4_ =
           Config::Color::getBGR
                     ((Color *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                 (ulong)(uVar1 * uVar2),(value_type *)((long)&__range2 + 4),
                 (allocator<unsigned_int> *)((long)&__range2 + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
      __end2 = std::
               map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
               ::begin((map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                        *)this);
      kv = (pair<const_unsigned_int,_GlyphInfo> *)
           std::
           map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
           ::end((map<unsigned_int,_GlyphInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
                  *)this);
      while (bVar3 = std::operator!=(&__end2,(_Self *)&kv), bVar3) {
        glyph = (GlyphInfo *)
                std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_GlyphInfo>_>::operator*
                          (&__end2);
        _y = &((reference)glyph)->second;
        if ((_y->page == (uint)s) && (bVar3 = GlyphInfo::isEmpty(_y), !bVar3)) {
          local_bc = _y->x + glyphs[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_c0 = _y->y + *(int *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count + 4);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,0);
          x_00 = local_bc;
          y_00 = local_c0;
          uVar1 = *surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          uVar2 = surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[1];
          ch = glyph->page;
          color = Config::Color::getBGR
                            ((Color *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_right);
          ft::Font::renderGlyph
                    ((GlyphMetrics *)((long)&cur + 4),(Font *)config,pvVar11,uVar1,uVar2,x_00,y_00,
                     ch,color);
        }
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_GlyphInfo>_>::operator++(&__end2)
        ;
      }
      if (((ulong)glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right & 0x1000000000000)
          == 0) {
        end = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
        _bgColor = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
        a0 = Config::Color::getBGR
                       ((Color *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
        a1 = Config::Color::getBGR
                       ((Color *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_right + 3));
        for (; end <= _bgColor; end = end + 1) {
          rb1 = *end >> 0x18;
          rb2 = 0x100 - rb1;
          uVar4 = rb2 * (a1 & 0xff00ff);
          g1 = uVar4 >> 8;
          uVar5 = rb1 * (a0 & 0xff00ff);
          g2 = uVar5 >> 8;
          uVar6 = rb2 * (a1 & 0xff00);
          local_10c = uVar6 >> 8;
          uVar7 = rb1 * (a0 & 0xff00);
          local_110 = uVar7 >> 8;
          *end = ((uVar4 | uVar5) >> 8 & 0xff00ff) + ((uVar6 | uVar7) >> 8 & 0xff00);
        }
      }
      std::__cxx11::stringstream::stringstream(local_298);
      std::operator<<(local_288,(string *)&glyphs[3]._M_t._M_impl.super__Rb_tree_header);
      if (*(int *)&glyphs[4]._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 != 2) {
        std::operator<<(local_288,"_");
        if (*(int *)&glyphs[4]._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 == 0) {
          fileName.field_2._M_local_buf[0xf] = (char)std::setfill<char>('0');
          poVar10 = std::operator<<(local_288,fileName.field_2._M_local_buf[0xf]);
          local_58 = (int)sVar9;
          fileName.field_2._8_4_ = std::setw(local_58);
          std::operator<<(poVar10,(_Setw)fileName.field_2._8_4_);
        }
        std::ostream::operator<<(local_288,(uint)s);
      }
      std::operator<<(local_288,".png");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::string((string *)&local_300,(string *)local_2c0);
      extractFileName(&local_2e0,&local_300);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,0);
      savePng((string *)local_2c0,pvVar11,
              *surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
              surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[1],
              (bool)(*(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                                      _M_right + 6) & 1));
      std::__cxx11::string::~string((string *)local_2c0);
      std::__cxx11::stringstream::~stringstream(local_298);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> App::renderTextures(const Glyphs& glyphs, const Config& config, const ft::Font& font, const std::vector<Config::Size>& pages)
{
    std::vector<std::string> fileNames;
    if (pages.empty())
        return {};

    const auto pageNameDigits = getNumberLen(pages.size() - 1);

    for (std::uint32_t page = 0; page < pages.size(); ++page)
    {
        const Config::Size& s = pages[page];
        std::vector<std::uint32_t> surface(s.w * s.h, config.color.getBGR());

        // Render every glyph
        //TODO: do not repeat same glyphs (with same index)
        for (const auto& kv: glyphs)
        {
            const auto& glyph = kv.second;
            if (glyph.page != page)
                continue;

            if (!glyph.isEmpty())
            {
                const auto x = glyph.x + config.padding.left;
                const auto y = glyph.y + config.padding.up;

                font.renderGlyph(&surface[0], s.w, s.h, x, y,
                        kv.first, config.color.getBGR());
            }
        }

        if (!config.backgroundTransparent)
        {
            auto cur = surface.data();
            const auto end = &surface.back();

            const auto fgColor = config.color.getBGR();
            const auto bgColor = config.backgroundColor.getBGR();

            while (cur <= end)
            {
                const std::uint32_t a0 = (*cur) >> 24u;
                const std::uint32_t a1 = 256 - a0;
                const std::uint32_t rb1 = (a1 * (bgColor & 0xFF00FFu)) >> 8u;
                const std::uint32_t rb2 = (a0 * (fgColor & 0xFF00FFu)) >> 8u;
                const std::uint32_t g1  = (a1 * (bgColor & 0x00FF00u)) >> 8u;
                const std::uint32_t g2  = (a0 * (fgColor & 0x00FF00u)) >> 8u;
                *cur =  ((rb1 | rb2) & 0xFF00FFu) + ((g1 | g2) & 0x00FF00u);
                ++cur;
            }
        }

        std::stringstream ss;
        ss << config.output;
        if (config.textureNameSuffix != Config::TextureNameSuffix::None)
        {
            ss << "_";
            if (config.textureNameSuffix == Config::TextureNameSuffix::IndexAligned)
                ss << std::setfill ('0') << std::setw(pageNameDigits);
            ss << page;
        }
        ss << ".png";
        const auto fileName = ss.str();
        fileNames.push_back(extractFileName(fileName));

        savePng(fileName, &surface[0], s.w, s.h, config.backgroundTransparent);
    }

    return fileNames;
}